

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool char1(Env *env,int32_t c)

{
  State *pSVar1;
  uint uVar2;
  TSLexer *pTVar3;
  
  pSVar1 = env->state;
  uVar2 = (pSVar1->lookahead).offset + 1;
  if (uVar2 < (pSVar1->lookahead).size) {
    pTVar3 = (TSLexer *)((pSVar1->lookahead).contents + uVar2);
  }
  else {
    advance_before(env,1);
    pTVar3 = env->lexer;
  }
  return pTVar3->lookahead == c;
}

Assistant:

static bool char1(Env *env, int32_t c) {
  return char_at(env, 1, c);
}